

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O1

void anon_unknown.dwarf_4023::PrintUsage(ostream *stream)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  
  cVar2 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," mlpg - maximum-likelihood parameter generation",0x2f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       mlpg [ options ] [ infile ] > stdout",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -l l          : length of vector        (   int)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 1 <= l <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -m m          : order of vector         (   int)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"l-1",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][ 0 <= m <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -s s          : number of past frames   (   int)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ r <= s <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -q q          : input format            (   int)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 0 <= q <= 2 ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                         0 (mean and variance)",0x2e);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                         1 (mean and precision)",0x2f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                         2 (mean x precision and precision)",0x3b);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -d d1 d2 ...  : delta coefficients      (double)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -D D          : filename of double type (string)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                       delta coefficients",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -r r1 (r2)    : width of regression     (   int)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                       coefficients",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -magic magic  : magic number            (double)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -R            : mode                    (   int)[",0x38);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 0 <= R <= 1 ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                         0 (recursive)",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                         1 (non-recursive)",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h            : print this message",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  infile:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       mean and variance parameter sequence    (double)[stdin]",0x3e);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       static parameter sequence               (double)",0x37);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  notice:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -d and -D options can be given multiple times",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -s option is valid only with R=0",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -magic option is not supported with R=0",0x2e);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " mlpg - maximum-likelihood parameter generation" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       mlpg [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l          : length of vector        (   int)[" << std::setw(5) << std::right << kDefaultNumOrder + 1 << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m          : order of vector         (   int)[" << std::setw(5) << std::right << "l-1"                << "][ 0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       -s s          : number of past frames   (   int)[" << std::setw(5) << std::right << kDefaultNumPastFrame << "][ r <= s <=   ]" << std::endl;  // NOLINT
  *stream << "       -q q          : input format            (   int)[" << std::setw(5) << std::right << kDefaultInputFormat  << "][ 0 <= q <= 2 ]" << std::endl;  // NOLINT
  *stream << "                         0 (mean and variance)" << std::endl;
  *stream << "                         1 (mean and precision)" << std::endl;
  *stream << "                         2 (mean x precision and precision)" << std::endl;  // NOLINT
  *stream << "       -d d1 d2 ...  : delta coefficients      (double)[" << std::setw(5) << std::right << "N/A"                << "]" << std::endl;  // NOLINT
  *stream << "       -D D          : filename of double type (string)[" << std::setw(5) << std::right << "N/A"                << "]" << std::endl;  // NOLINT
  *stream << "                       delta coefficients" << std::endl;
  *stream << "       -r r1 (r2)    : width of regression     (   int)[" << std::setw(5) << std::right << "N/A"                << "]" << std::endl;  // NOLINT
  *stream << "                       coefficients" << std::endl;
  *stream << "       -magic magic  : magic number            (double)[" << std::setw(5) << std::right << "N/A"                << "]" << std::endl;  // NOLINT
  *stream << "       -R            : mode                    (   int)[" << std::setw(5) << std::right << kDefaultMode         << "][ 0 <= R <= 1 ]" << std::endl;  // NOLINT
  *stream << "                         0 (recursive)" << std::endl;
  *stream << "                         1 (non-recursive)" << std::endl;
  *stream << "       -h            : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       mean and variance parameter sequence    (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       static parameter sequence               (double)" << std::endl;  // NOLINT
  *stream << "  notice:" << std::endl;
  *stream << "       -d and -D options can be given multiple times" << std::endl;  // NOLINT
  *stream << "       -s option is valid only with R=0" << std::endl;
  *stream << "       -magic option is not supported with R=0" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}